

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.h
# Opt level: O3

void __thiscall
llvm::line_iterator::line_iterator
          (line_iterator *this,MemoryBuffer *Buffer,bool SkipBlanks,char CommentMarker)

{
  char *pcVar1;
  char *pcVar2;
  MemoryBuffer *pMVar3;
  
  pcVar1 = Buffer->BufferStart;
  pcVar2 = Buffer->BufferEnd;
  pMVar3 = (MemoryBuffer *)0x0;
  if (pcVar2 != pcVar1) {
    pMVar3 = Buffer;
  }
  this->Buffer = pMVar3;
  this->CommentMarker = CommentMarker;
  this->SkipBlanks = SkipBlanks;
  this->LineNumber = 1;
  if (pcVar2 == pcVar1) {
    (this->CurrentLine).Data = (char *)0x0;
    (this->CurrentLine).Length = 0;
    return;
  }
  (this->CurrentLine).Data = pcVar1;
  (this->CurrentLine).Length = 0;
  if (*pcVar2 != '\0') {
    __assert_fail("Buffer.getBufferEnd()[0] == \'\\0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/LineIterator.cpp"
                  ,0x2b,"llvm::line_iterator::line_iterator(const MemoryBuffer &, bool, char)");
  }
  if ((!SkipBlanks) && ((*pcVar1 == '\n' || ((*pcVar1 == '\r' && (pcVar1[1] == '\n')))))) {
    return;
  }
  advance(this);
  return;
}

Assistant:

size_t getBufferSize() const { return BufferEnd-BufferStart; }